

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

void __thiscall GGWave::GGWave(GGWave *this,Parameters *parameters)

{
  Rx *in_RSI;
  undefined4 *in_RDI;
  GGWave *in_stack_00000018;
  
  *in_RDI = 0xbf800000;
  in_RDI[1] = 0xbf800000;
  in_RDI[2] = 0xbf800000;
  in_RDI[3] = 0xffffffff;
  in_RDI[4] = 0xbf800000;
  in_RDI[5] = 0xffffffff;
  in_RDI[6] = 0xffffffff;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0xbf800000;
  in_RDI[10] = 0xbf800000;
  in_RDI[0xb] = 0xffffffff;
  in_RDI[0xc] = 0xbf800000;
  in_RDI[0xd] = 0xffffffff;
  in_RDI[0xe] = 0xffffffff;
  in_RDI[0xf] = 0xffffffff;
  in_RDI[0x10] = 0xbf800000;
  *(undefined1 *)(in_RDI + 0x11) = 0;
  in_RDI[0x12] = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x13) = 0;
  *(undefined1 *)((long)in_RDI + 0x4d) = 0;
  *(undefined1 *)((long)in_RDI + 0x4e) = 0;
  *(undefined1 *)((long)in_RDI + 0x4f) = 0;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  ggvector<unsigned_char>::ggvector((ggvector<unsigned_char> *)(in_RDI + 0x16));
  ggvector<unsigned_char>::ggvector((ggvector<unsigned_char> *)(in_RDI + 0x1a));
  ggvector<unsigned_char>::ggvector((ggvector<unsigned_char> *)(in_RDI + 0x1e));
  Rx::Rx(in_RSI);
  Tx::Tx((Tx *)in_RSI);
  Resampler::Resampler((Resampler *)in_RSI);
  *(undefined8 *)(in_RDI + 0x16a) = 0;
  in_RDI[0x16c] = 0;
  prepare(in_stack_00000018,(Parameters *)this,parameters._7_1_);
  return;
}

Assistant:

GGWave::GGWave(const Parameters & parameters) {
    prepare(parameters);
}